

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O3

void __thiscall
SQCompilation::RenderVisitor::visitIfStatement(RenderVisitor *this,IfStatement *ifstmt)

{
  int iVar1;
  
  OutputStream::writeString(this->_out,"IF (");
  Node::visit<SQCompilation::RenderVisitor>(&ifstmt->_cond->super_Node,this);
  OutputStream::writeString(this->_out,")\n");
  iVar1 = (int)this->_indent;
  if (0 < iVar1) {
    do {
      OutputStream::writeInt8(this->_out,' ');
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  OutputStream::writeString(this->_out,"THEN ");
  this->_indent = this->_indent + 2;
  Node::visit<SQCompilation::RenderVisitor>(&ifstmt->_thenB->super_Node,this);
  if (ifstmt->_elseB != (Statement *)0x0) {
    OutputStream::writeChar(this->_out,'\n');
    iVar1 = (int)this->_indent + -2;
    if (0 < iVar1) {
      do {
        OutputStream::writeInt8(this->_out,' ');
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    OutputStream::writeString(this->_out,"ELSE ");
    Node::visit<SQCompilation::RenderVisitor>(&ifstmt->_elseB->super_Node,this);
  }
  this->_indent = this->_indent + -2;
  OutputStream::writeChar(this->_out,'\n');
  iVar1 = (int)this->_indent;
  if (0 < iVar1) {
    do {
      OutputStream::writeInt8(this->_out,' ');
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  OutputStream::writeString(this->_out,"END_IF");
  return;
}

Assistant:

virtual void visitIfStatement(IfStatement *ifstmt) {
        _out->writeString("IF (");
        ifstmt->condition()->visit(this);
        _out->writeString(")\n");
        indent(_indent);
        _out->writeString("THEN ");
        _indent += 2;
        ifstmt->thenBranch()->visit(this);
        if (ifstmt->elseBranch()) {
            newLine();
            indent(_indent - 2);
            _out->writeString("ELSE ");
            ifstmt->elseBranch()->visit(this);
        }
        _indent -= 2;
        newLine();
        indent(_indent);
        _out->writeString("END_IF");

    }